

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall RandomBotStrategy::chooseRandomNeighbour(RandomBotStrategy *this)

{
  result_type_conflict rVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_00;
  size_type sVar2;
  uniform_int_distribution<int> local_1c;
  uniform_int_distribution<int> dis;
  int numberOfNeighbours;
  RandomBotStrategy *this_local;
  
  unique0x10000090 = this;
  this_00 = Map::Country::getAdjCountries((this->super_PlayerStrategy).from);
  sVar2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(this_00);
  dis._M_param._M_a = (int)sVar2;
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_1c,0,dis._M_param._M_a + -1);
  rVar1 = std::uniform_int_distribution<int>::operator()
                    (&local_1c,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)&stack0x00000008);
  return rVar1;
}

Assistant:

int RandomBotStrategy::chooseRandomNeighbour(std::mt19937 gen) {
    int numberOfNeighbours = this->from->getAdjCountries()->size();
    std::uniform_int_distribution<> dis(0, numberOfNeighbours - 1);
    return dis(gen);
}